

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O3

_Bool player_restore_mana(player *p,wchar_t amt)

{
  uint32_t *puVar1;
  short sVar2;
  undefined2 uVar3;
  short sVar4;
  
  sVar2 = p->csp;
  sVar4 = (short)amt + sVar2;
  uVar3 = p->msp;
  if ((short)uVar3 <= sVar4) {
    sVar4 = uVar3;
  }
  p->csp = sVar4;
  puVar1 = &p->upkeep->redraw;
  *puVar1 = *puVar1 | 0x80;
  msg("You feel some of your energies returning.");
  return p->csp != sVar2;
}

Assistant:

bool player_restore_mana(struct player *p, int amt) {
	int old_csp = p->csp;

	p->csp += amt;
	if (p->csp > p->msp) {
		p->csp = p->msp;
	}
	p->upkeep->redraw |= PR_MANA;

	msg("You feel some of your energies returning.");

	return p->csp != old_csp;
}